

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

Buffer __thiscall xmrig::Buffer::fromHex(Buffer *this,char *data,size_t size)

{
  bool bVar1;
  uint8_t *out;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ulong __n;
  Buffer BVar2;
  
  if (data == (char *)0x0 || (size & 1) != 0) {
    this->m_data = (char *)0x0;
    this->m_size = 0;
  }
  else {
    __n = size >> 1;
    out = (uint8_t *)operator_new__(__n);
    memset(out,0,__n);
    bVar1 = fromHex((uint8_t *)data,size,out);
    if (bVar1) {
      this->m_data = (char *)out;
      this->m_size = __n;
      out = (uint8_t *)0x0;
    }
    else {
      this->m_data = (char *)0x0;
      this->m_size = 0;
    }
    size = extraout_RDX;
    if (out != (uint8_t *)0x0) {
      operator_delete__(out);
      size = extraout_RDX_00;
    }
  }
  BVar2.m_size = size;
  BVar2.m_data = (char *)this;
  return BVar2;
}

Assistant:

xmrig::Buffer xmrig::Buffer::fromHex(const char *data, size_t size)
{
    if (data == nullptr || size % 2 != 0) {
        return {};
    }

    Buffer buf(size / 2);
    if (!fromHex(data, size, buf.data())) {
        return {};
    }

    return buf;
}